

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::
PlainTemplatedDefines<unsigned_char,duckdb::TemplatedParquetValueConversion<unsigned_int>,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  bool bVar1;
  Vector *in_RDX;
  idx_t in_RSI;
  Vector *in_RDI;
  ByteBuffer *in_R9;
  uint8_t *unaff_retaddr;
  
  bVar1 = TemplatedParquetValueConversion<unsigned_int>::PlainAvailable(in_R9,(idx_t)in_RDI);
  if (bVar1) {
    PlainTemplatedInternal<unsigned_char,duckdb::TemplatedParquetValueConversion<unsigned_int>,false,false>
              ((ColumnReader *)defines,(ByteBuffer *)num_values,(uint8_t *)result_offset,
               (uint64_t)result,(idx_t)unaff_retaddr,in_RDI);
  }
  else {
    PlainTemplatedInternal<unsigned_char,duckdb::TemplatedParquetValueConversion<unsigned_int>,false,true>
              ((ColumnReader *)result_offset,(ByteBuffer *)result,unaff_retaddr,(uint64_t)in_RDI,
               in_RSI,in_RDX);
  }
  return;
}

Assistant:

void PlainTemplatedDefines(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, idx_t result_offset,
	                           Vector &result) {
		if (CONVERSION::PlainAvailable(plain_data, num_values)) {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, false>(plain_data, defines, num_values,
			                                                                   result_offset, result);
		} else {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, true>(plain_data, defines, num_values,
			                                                                  result_offset, result);
		}
	}